

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O0

EStatusCode __thiscall
ObjectsContext::WriteXrefStream(ObjectsContext *this,DictionaryContext *inDictionaryContext)

{
  size_t sVar1;
  DictionaryContext *this_00;
  ObjectIDType OVar2;
  ObjectIDType OVar3;
  ObjectWriteInformation *pOVar4;
  PDFStream *this_01;
  IByteWriter *pIVar5;
  Trace *this_02;
  ObjectWriteInformation *pOVar6;
  bool bVar7;
  byte local_f9;
  byte local_e9;
  ObjectWriteInformation *objectReference;
  ObjectIDType i;
  ObjectIDType nextFreeObject;
  EStatusCode status;
  PDFStream *aStream;
  string local_98;
  size_t local_78;
  size_t generationSize;
  size_t locationSize;
  size_t typeSize;
  ObjectIDType firstIDNotInRange;
  ObjectIDType startID;
  allocator<char> local_39;
  string local_38;
  DictionaryContext *local_18;
  DictionaryContext *inDictionaryContext_local;
  ObjectsContext *this_local;
  
  local_18 = inDictionaryContext;
  inDictionaryContext_local = (DictionaryContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Index",&local_39);
  DictionaryContext::WriteKey(inDictionaryContext,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  StartArray(this);
  firstIDNotInRange = 0;
  while (OVar3 = firstIDNotInRange,
        OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry),
        OVar3 < OVar2) {
    typeSize = firstIDNotInRange;
    while( true ) {
      sVar1 = typeSize;
      OVar3 = IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry);
      local_e9 = 0;
      if (sVar1 < OVar3) {
        pOVar4 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                           (&this->mReferencesRegistry,typeSize);
        local_e9 = pOVar4->mIsDirty;
      }
      if ((local_e9 & 1) == 0) break;
      typeSize = typeSize + 1;
    }
    PrimitiveObjectsWriter::WriteInteger
              (&this->mPrimitiveWriter,firstIDNotInRange,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteInteger
              (&this->mPrimitiveWriter,typeSize - firstIDNotInRange,eTokenSeparatorSpace);
    firstIDNotInRange = typeSize;
    while( true ) {
      OVar3 = firstIDNotInRange;
      OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry);
      local_f9 = 0;
      if (OVar3 < OVar2) {
        pOVar4 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                           (&this->mReferencesRegistry,firstIDNotInRange);
        local_f9 = pOVar4->mIsDirty ^ 0xff;
      }
      if ((local_f9 & 1) == 0) break;
      firstIDNotInRange = firstIDNotInRange + 1;
    }
  }
  EndArray(this,eTokenSeparatorNone);
  EndLine(this);
  this_00 = local_18;
  locationSize = 1;
  generationSize = 8;
  local_78 = 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"W",(allocator<char> *)((long)&aStream + 7));
  DictionaryContext::WriteKey(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aStream + 7));
  StartArray(this);
  WriteInteger(this,locationSize,eTokenSeparatorSpace);
  WriteInteger(this,generationSize,eTokenSeparatorSpace);
  WriteInteger(this,local_78,eTokenSeparatorSpace);
  EndArray(this,eTokenSeparatorNone);
  EndLine(this);
  this_01 = StartPDFStream(this,local_18,true);
  nextFreeObject._4_4_ = eSuccess;
  i = 0;
  for (objectReference = (ObjectWriteInformation *)0x0;
      pOVar4 = (ObjectWriteInformation *)
               IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry),
      objectReference < pOVar4 && nextFreeObject._4_4_ == eSuccess;
      objectReference = (ObjectWriteInformation *)&objectReference->mIsDirty) {
    pOVar4 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                       (&this->mReferencesRegistry,(ObjectIDType)objectReference);
    if ((pOVar4->mIsDirty & 1U) != 0) {
      pOVar4 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                         (&this->mReferencesRegistry,(ObjectIDType)objectReference);
      if (pOVar4->mObjectReferenceType == Used) {
        if ((pOVar4->mObjectWritten & 1U) == 0) {
          nextFreeObject._4_4_ = eFailure;
          this_02 = Trace::DefaultTrace();
          Trace::TraceToLog(this_02,
                            "ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written"
                            ,objectReference);
        }
        else {
          pIVar5 = PDFStream::GetWriteStream(this_01);
          WriteXrefNumber(this,pIVar5,1,locationSize);
          pIVar5 = PDFStream::GetWriteStream(this_01);
          WriteXrefNumber(this,pIVar5,pOVar4->mWritePosition,generationSize);
          pIVar5 = PDFStream::GetWriteStream(this_01);
          WriteXrefNumber(this,pIVar5,pOVar4->mGenerationNumber,local_78);
        }
      }
      else {
        do {
          i = i + 1;
          OVar3 = IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry);
          bVar7 = false;
          if (i < OVar3) {
            pOVar6 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                               (&this->mReferencesRegistry,i);
            bVar7 = true;
            if ((pOVar6->mIsDirty & 1U) != 0) {
              pOVar6 = IndirectObjectsReferenceRegistry::GetNthObjectReference
                                 (&this->mReferencesRegistry,i);
              bVar7 = pOVar6->mObjectReferenceType != Free;
            }
          }
        } while (bVar7);
        OVar3 = IndirectObjectsReferenceRegistry::GetObjectsCount(&this->mReferencesRegistry);
        if (i == OVar3) {
          i = 0;
        }
        pIVar5 = PDFStream::GetWriteStream(this_01);
        WriteXrefNumber(this,pIVar5,0,locationSize);
        pIVar5 = PDFStream::GetWriteStream(this_01);
        WriteXrefNumber(this,pIVar5,i,generationSize);
        pIVar5 = PDFStream::GetWriteStream(this_01);
        WriteXrefNumber(this,pIVar5,pOVar4->mGenerationNumber,local_78);
      }
    }
  }
  if (nextFreeObject._4_4_ == eSuccess) {
    nextFreeObject._4_4_ = EndPDFStream(this,this_01);
  }
  return nextFreeObject._4_4_;
}

Assistant:

EStatusCode ObjectsContext::WriteXrefStream(DictionaryContext* inDictionaryContext)
{
    // k. complement input dictionary with the relevant entries - W and Index
    // then continue with a regular stream, forced to have "length" as direct object
    
    // write Index entry
    inDictionaryContext->WriteKey("Index");
    StartArray();
    
    ObjectIDType startID = 0;
    ObjectIDType firstIDNotInRange;
 
    while(startID < mReferencesRegistry.GetObjectsCount())
    {
        firstIDNotInRange = startID;
        
        // look for first ID that does not require update [for first version of PDF...it will be the end]
        while(firstIDNotInRange < mReferencesRegistry.GetObjectsCount() &&
              mReferencesRegistry.GetNthObjectReference(firstIDNotInRange).mIsDirty)
            ++firstIDNotInRange;
        
        // write section header
        mPrimitiveWriter.WriteInteger(startID);
        mPrimitiveWriter.WriteInteger(firstIDNotInRange - startID);
        
        startID = firstIDNotInRange;
        
        // now promote startID to the next object to update
        while(startID < mReferencesRegistry.GetObjectsCount() &&
              !mReferencesRegistry.GetNthObjectReference(startID).mIsDirty)
            ++startID;        
    }
    
    EndArray();
    EndLine();
    
    // write W entry, which is going to be 1 sizeof(long long) and sizeof(unsigned long), per the types i'm using
    
    size_t typeSize = 1;
    size_t locationSize = sizeof(LongFilePositionType);
    size_t generationSize = sizeof(unsigned long);
    
    inDictionaryContext->WriteKey("W");
    StartArray();
    WriteInteger(typeSize);
    WriteInteger(locationSize);
    WriteInteger(generationSize);
    EndArray();
    EndLine();
    
    // start the xref stream itself
    PDFStream* aStream = StartPDFStream(inDictionaryContext,true);
    
    // now write the table data itself
    EStatusCode status = eSuccess;
    ObjectIDType nextFreeObject = 0;
    
    do {
    
        for(ObjectIDType i = 0; i < mReferencesRegistry.GetObjectsCount() && eSuccess == status;++i)
        {
            if(!mReferencesRegistry.GetNthObjectReference(i).mIsDirty)
                continue;
     
            const ObjectWriteInformation& objectReference = mReferencesRegistry.GetNthObjectReference(i);

            if(objectReference.mObjectReferenceType == ObjectWriteInformation::Used)
            {
                // used object
                
                if(objectReference.mObjectWritten)
                {
                    WriteXrefNumber(aStream->GetWriteStream(),1,typeSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mWritePosition,locationSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                }
                else
                {
                    // object not written. at this point this should not happen, and indicates a failure
                    status = PDFHummus::eFailure;
                    TRACE_LOG1("ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written",i);
                }
            }
            else 
            {
                // free object
                
                ++nextFreeObject;
                // look for next dirty & free object, to be the next item of linked list
                while(nextFreeObject < mReferencesRegistry.GetObjectsCount() &&
                      (!mReferencesRegistry.GetNthObjectReference(nextFreeObject).mIsDirty ||
                       mReferencesRegistry.GetNthObjectReference(nextFreeObject).mObjectReferenceType != ObjectWriteInformation::Free))
                    ++nextFreeObject;
                
                // if reached end of list, then link back to head - 0
                if(nextFreeObject == mReferencesRegistry.GetObjectsCount())
                    nextFreeObject = 0;
     
                WriteXrefNumber(aStream->GetWriteStream(),0,typeSize);
                WriteXrefNumber(aStream->GetWriteStream(),nextFreeObject,locationSize);
                WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                
            }

        }
        
        if(status != eSuccess)
            break;
            
        // end the stream and g'bye
        status = EndPDFStream(aStream);

    } 
    while (false);

    return status;
}